

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O1

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_ExceptionAnyThrow_Test::Body
          (iu_SyntaxTest_x_iutest_x_ExceptionAnyThrow_Test *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = std::locale::locale;
  __cxa_throw(puVar1,&std::bad_exception::typeinfo,std::bad_exception::~bad_exception);
}

Assistant:

IUTEST(SyntaxTest, ExceptionAnyThrow)
{
    if( int x = 1 )
        IUTEST_ASSERT_ANY_THROW(throw ::std::bad_exception()) << x;
    if( int x = 1 )
        IUTEST_EXPECT_ANY_THROW(throw ::std::bad_exception()) << x;
    if( int x = 1 )
        IUTEST_INFORM_ANY_THROW(throw ::std::bad_exception()) << x;
    if( int x = 1 )
        IUTEST_ASSUME_ANY_THROW(throw ::std::bad_exception()) << x;
}